

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcrashhandler.cpp
# Opt level: O0

iovec QTest::CrashHandler::asyncSafeToString(int n,AsyncSafeIntBuffer *result)

{
  long lVar1;
  iovec iVar2;
  int iVar3;
  pointer pvVar4;
  pointer pvVar5;
  array<char,_12UL> *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  to_chars_result tVar6;
  int quot;
  int divider;
  char *ptr;
  to_chars_result r_1;
  iovec r;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  int local_44;
  char *local_40;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar4 = std::array<char,_12UL>::data((array<char,_12UL> *)0x168869);
  std::array<char,_12UL>::size(in_RSI);
  tVar6 = std::to_chars(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0,0x1688bf);
  local_40 = tVar6.ptr;
  if (tVar6.ec != 0) {
    local_40 = pvVar4;
    local_2c = in_EDI;
    if (in_EDI < 0) {
      local_40 = pvVar4 + 1;
      *pvVar4 = '-';
      local_2c = -in_EDI;
    }
    for (local_44 = 1000000000; local_44 != 0 && local_2c < local_44; local_44 = local_44 / 10) {
    }
    while (1 < local_44) {
      iVar3 = local_2c / local_44;
      local_2c = local_2c % local_44;
      local_44 = local_44 / 10;
      *local_40 = (char)iVar3 + '0';
      local_40 = local_40 + 1;
    }
    *local_40 = (char)local_2c + '0';
    local_40 = local_40 + 1;
  }
  pvVar4 = std::array<char,_12UL>::data((array<char,_12UL> *)0x1689c6);
  pvVar5 = std::array<char,_12UL>::data((array<char,_12UL> *)0x1689de);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar2.iov_len = (long)local_40 - (long)pvVar5;
    iVar2.iov_base = pvVar4;
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

struct iovec asyncSafeToString(int n, AsyncSafeIntBuffer &&result)
{
    char *ptr = result.array.data();
    if (false) {
#ifdef __cpp_lib_to_chars
    } else if (auto r = std::to_chars(ptr, ptr + result.array.size(), n, 10); r.ec == std::errc{}) {
        ptr = r.ptr;
#endif
    } else {
        // handle the sign
        if (n < 0) {
            *ptr++ = '-';
            n = -n;
        }

        // find the highest power of the base that is less than this number
        static constexpr int StartingDivider = ([]() {
            int divider = 1;
            for (int i = 0; i < std::numeric_limits<int>::digits10; ++i)
                divider *= 10;
            return divider;
        }());
        int divider = StartingDivider;
        while (divider && n < divider)
            divider /= 10;

        // now convert to string
        while (divider > 1) {
            int quot = n / divider;
            n = n % divider;
            divider /= 10;
            *ptr++ = quot + '0';
        }
        *ptr++ = n + '0';
    }

#ifndef QT_NO_DEBUG
    // this isn't necessary, it just helps in the debugger
    *ptr = '\0';
#endif
    struct iovec r;
    r.iov_base = result.array.data();
    r.iov_len = ptr - result.array.data();
    return r;
}